

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O3

void nni_msgq_close(nni_msgq *mq)

{
  nni_msg *m;
  uint uVar1;
  nni_aio *aio;
  uint uVar2;
  
  nni_mtx_lock(&mq->mq_lock);
  mq->mq_closed = true;
  uVar1 = mq->mq_len;
  if (uVar1 != 0) {
    do {
      uVar2 = mq->mq_get + 1;
      if (mq->mq_alloc <= uVar2) {
        uVar2 = 0;
      }
      m = mq->mq_msgs[mq->mq_get];
      mq->mq_get = uVar2;
      mq->mq_len = uVar1 - 1;
      nni_msg_free(m);
      uVar1 = mq->mq_len;
    } while (uVar1 != 0);
  }
  do {
    aio = (nni_aio *)nni_list_first(&mq->mq_aio_getq);
    if (aio == (nni_aio *)0x0) {
      aio = (nni_aio *)nni_list_first(&mq->mq_aio_putq);
      if (aio == (nni_aio *)0x0) {
        nni_mtx_unlock(&mq->mq_lock);
        return;
      }
    }
    nni_aio_list_remove(aio);
    nni_aio_finish_error(aio,NNG_ECLOSED);
  } while( true );
}

Assistant:

void
nni_msgq_close(nni_msgq *mq)
{
	nni_aio *aio;

	nni_mtx_lock(&mq->mq_lock);
	mq->mq_closed = true;
	// Free the messages orphaned in the queue.
	while (mq->mq_len > 0) {
		nni_msg *msg = mq->mq_msgs[mq->mq_get++];
		if (mq->mq_get >= mq->mq_alloc) {
			mq->mq_get = 0;
		}
		mq->mq_len--;
		nni_msg_free(msg);
	}

	// Let all pending blockers know we are closing the queue.
	while (((aio = nni_list_first(&mq->mq_aio_getq)) != NULL) ||
	    ((aio = nni_list_first(&mq->mq_aio_putq)) != NULL)) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}

	nni_mtx_unlock(&mq->mq_lock);
}